

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

void __thiscall
avro::BinaryDecoder::decodeBytes
          (BinaryDecoder *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  int iVar1;
  uint8_t *b;
  StreamReader *in_RSI;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  size_t len;
  long *__new_size;
  
  __new_size = in_RDI;
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  b = (uint8_t *)(long)iVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  if (b != (uint8_t *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,0);
    StreamReader::readBytes(in_RSI,b,(size_t)in_RDI);
  }
  return;
}

Assistant:

void BinaryDecoder::decodeBytes(std::vector<uint8_t>& value)
{
    size_t len = decodeInt();
    value.resize(len);
    if (len > 0) {
        in_.readBytes(&value[0], len);
    }
}